

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

void gimage::loadViewProperties(Properties *prop,char *name,char *spath,bool verbose)

{
  char *__rhs;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined7 in_register_00000009;
  size_t i;
  ulong uVar4;
  long lVar5;
  allocator local_14d;
  undefined4 local_14c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string s;
  Vector3d T;
  string depthname;
  Matrix33d A;
  double t;
  Properties mprop;
  
  local_14c = (undefined4)CONCAT71(in_register_00000009,verbose);
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&A,name,(allocator *)&mprop);
  gutil::split((vector *)&list,(string *)&A,',',true);
  std::__cxx11::string::~string((string *)&A);
  lVar5 = 0x20;
  bVar1 = false;
  for (uVar4 = 1;
      uVar4 < (ulong)((long)list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    iVar2 = std::__cxx11::string::compare
                      ((long)&((list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar5,0,(char *)0x2);
    if (iVar2 == 0) {
      std::__cxx11::string::substr
                ((ulong)&A,
                 (long)&((list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5);
      gutil::Properties::load((char *)prop);
      std::__cxx11::string::~string((string *)&A);
      bVar1 = true;
    }
    lVar5 = lVar5 + 0x20;
  }
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)&depthname,
               (string *)
               list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list);
    getPrefixAlternatives(&list,&depthname,spath);
    uVar4 = (ulong)((long)list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff;
    while (0 < (int)uVar4) {
      uVar4 = uVar4 - 1;
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
        __rhs = *(char **)((long)&DAT_00137ad0 + lVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&A,
                       list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar4,__rhs);
        gutil::Properties::load((char *)prop);
        std::__cxx11::string::~string((string *)&A);
        if ((char)local_14c != '\0') {
          poVar3 = std::operator<<((ostream *)&std::cout,"Using parameter file: ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&A,
                         list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar4,__rhs);
          poVar3 = std::operator<<(poVar3,(string *)&A);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&A);
        }
      }
    }
    lVar5 = std::__cxx11::string::find_last_of((char *)&depthname,0x12d5b3);
    if (8 < depthname._M_string_length - (lVar5 + 1)) {
      std::__cxx11::string::substr((ulong)&A,(ulong)&depthname);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &A,"disp");
      std::__cxx11::string::~string((string *)&A);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&A,(ulong)&depthname);
        std::operator+(&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&A,
                       "calib.txt");
        std::__cxx11::string::~string((string *)&A);
        mprop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &mprop.data._M_t._M_impl.super__Rb_tree_header._M_header;
        mprop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mprop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        mprop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mprop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             mprop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        gutil::Properties::load((char *)&mprop);
        if ((char)local_14c != '\0') {
          poVar3 = std::operator<<((ostream *)&std::cout,"Using Middlebury calibration file: ");
          poVar3 = std::operator<<(poVar3,(string *)&s);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        gutil::Properties::getString((char *)&mprop,(string *)0x12d615,(char *)&s);
        gutil::Properties::putString((char *)prop,(string *)"camera.width");
        gutil::Properties::getString((char *)&mprop,(string *)0x12d622,(char *)&s);
        gutil::Properties::putString((char *)prop,(string *)"camera.height");
        gmath::SMatrix<double,_3,_3>::SMatrix(&A);
        std::__cxx11::string::string((string *)&t,"cam",&local_14d);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&T,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,
                       depthname._M_dataplus._M_p[lVar5 + 5]);
        gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
                  (&mprop,(char *)T.v[0],&A,(char *)0x0);
        std::__cxx11::string::~string((string *)&T);
        std::__cxx11::string::~string((string *)&t);
        gutil::Properties::putValue<gmath::SMatrix<double,3,3>>(prop,"camera.A",&A);
        gutil::Properties::putValue<double>(prop,"f",(double *)&A);
        gutil::Properties::getValue<double>(&mprop,"baseline",&t,(char *)0x0);
        gutil::Properties::putValue<double>(prop,"t",&t);
        gutil::Properties::getString((char *)&mprop,(string *)"doffs",(char *)&s);
        gutil::Properties::putString((char *)prop,(string *)"disp.offset");
        std::__cxx11::string::string((string *)&T,"[1 0 0; 0 1 0; 0 0 1]",&local_14d);
        gutil::Properties::putString((char *)prop,(string *)"camera.R");
        std::__cxx11::string::~string((string *)&T);
        gmath::SVector<double,_3>::SVector(&T);
        T.v[0] = (double)(depthname._M_dataplus._M_p[lVar5 + 5] + -0x30) * t;
        gutil::Properties::putValue<gmath::SVector<double,3>>(prop,"camera.T",&T);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&mprop);
        std::__cxx11::string::~string((string *)&s);
      }
    }
    std::__cxx11::string::~string((string *)&depthname);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  return;
}

Assistant:

void loadViewProperties(gutil::Properties &prop, const char *name, const char *spath,
                        bool verbose)
{
  std::vector<std::string> list;

  // load parameter files as specified in name

  gutil::split(list, name, ',');

  bool expl=false;

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "p=") == 0)
    {
      prop.load(list[i].substr(2).c_str());
      expl=true;
    }
  }

  // alternatively, search for parameter files

  if (!expl)
  {
    std::string depthname=list[0];
    const char *suffix[]= {".txt", ".TXT", "_param.txt", "_PARAM.TXT"};

    list.clear();
    getPrefixAlternatives(list, depthname, spath);

    for (int i=static_cast<int>(list.size())-1; i>=0; i--)
    {
      for (int k=0; k<4; k++)
      {
        // try all possibilities and add parameters

        try
        {
          prop.load((list[i]+suffix[k]).c_str());

          if (verbose)
          {
            std::cout << "Using parameter file: " << list[i]+suffix[k] << std::endl;
          }
        }
        catch (const gutil::Exception &)
        { }
      }
    }

    // support format of Middlebury stereo benchmark data sets

    size_t pos;

    pos=depthname.find_last_of("/\\");

    if (pos == depthname.npos)
    {
      pos=0;
    }
    else
    {
      pos++;
    }

    if (depthname.size()-pos >= 9 && depthname.substr(pos, 4) == "disp")
    {
      try
      {
        std::string s=depthname.substr(0, pos)+"calib.txt";
        gutil::Properties mprop;
        mprop.load(s.c_str());

        if (verbose)
        {
          std::cout << "Using Middlebury calibration file: " << s << std::endl;
        }

        mprop.getString("width", s, "0");
        prop.putString("camera.width", s);
        mprop.getString("height", s, "0");
        prop.putString("camera.height", s);

        gmath::Matrix33d A;
        mprop.getValue((std::string("cam")+depthname[pos+4]).c_str(), A);
        prop.putValue("camera.A", A);

        prop.putValue("f", A(0, 0));

        double t;
        mprop.getValue("baseline", t);
        prop.putValue("t", t);

        mprop.getString("doffs", s, "0");
        prop.putString("disp.offset", s);

        prop.putString("camera.R", "[1 0 0; 0 1 0; 0 0 1]");

        gmath::Vector3d T;
        T[0]=t*(depthname[pos+4]-'0');
        prop.putValue("camera.T", T);
      }
      catch (const gutil::IOException &)
      { }
      catch (const gutil::Exception &ex)
      {
        std::cerr << ex.what() << std::endl;
      }
    }
  }
}